

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<signed_char*>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,char **args)

{
  ostringstream oss;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  format<signed_char*>((ostream *)aoStack_198,(char *)this,(char **)fmt);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}